

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::onDrained(NetworkAddressHttpClient *this)

{
  SourceLocation location;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar1;
  long in_RSI;
  NetworkAddressHttpClient *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_60;
  SourceLocation local_48;
  undefined1 local_30 [8];
  PromiseFulfillerPair<void> paf;
  NetworkAddressHttpClient *this_local;
  
  this_00 = this;
  SourceLocation::SourceLocation
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"onDrained",0x174e,0x10);
  location.function = (char *)local_48._16_8_;
  location.fileName = local_48.function;
  location._16_8_ = this_00;
  newPromiseAndFulfiller<void>(location);
  t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&local_60,t);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x58),
             &local_60);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_60);
  pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_30);
  Promise<void>::Promise((Promise<void> *)this_00,pPVar1);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> onDrained() {
    // Returns a promise which resolves the next time isDrained() transitions from false to true.
    auto paf = kj::newPromiseAndFulfiller<void>();
    drainedFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }